

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void parse_block(LexState *ls)

{
  undefined8 *in_RDI;
  FuncScope bl;
  FuncState *fs;
  LexState *in_stack_ffffffffffffffe0;
  FuncState *fs_00;
  
  fs_00 = (FuncState *)*in_RDI;
  fscope_begin(fs_00,(FuncScope *)&stack0xffffffffffffffe0,0);
  parse_chunk(in_stack_ffffffffffffffe0);
  fscope_end(fs_00);
  return;
}

Assistant:

static void parse_block(LexState *ls)
{
  FuncState *fs = ls->fs;
  FuncScope bl;
  fscope_begin(fs, &bl, 0);
  parse_chunk(ls);
  fscope_end(fs);
}